

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::CommandLineInterfaceTester
          (CommandLineInterfaceTester *this)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  AlphaNum *in_RCX;
  Status *local_150;
  LogMessage local_f0;
  Voidify local_d9;
  Status local_d8;
  undefined1 local_d0 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  AlphaNum local_70;
  string local_40;
  CommandLineInterfaceTester *local_10;
  CommandLineInterfaceTester *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CommandLineInterfaceTester_02a2a460;
  CommandLineInterface::CommandLineInterface(&this->cli_);
  std::__cxx11::string::string((string *)&this->temp_directory_);
  std::__cxx11::string::string((string *)&this->captured_stderr_);
  std::__cxx11::string::string((string *)&this->captured_stdout_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ::vector(&this->generators_);
  TestTempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_70,&local_90);
  absl::lts_20250127::AlphaNum::AlphaNum
            ((AlphaNum *)&absl_log_internal_check_ok_goo.second,"/proto2_cli_test_temp");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_40,(lts_20250127 *)&local_70,(AlphaNum *)&absl_log_internal_check_ok_goo.second,
             in_RCX);
  std::__cxx11::string::operator=((string *)&this->temp_directory_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = anon_unknown_3::FileExists(&this->temp_directory_);
  if (bVar1) {
    File::DeleteRecursively(&this->temp_directory_,(void *)0x0,(void *)0x0);
  }
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_d0);
  File::CreateDir((File *)&local_d8,&this->temp_directory_,0x1ff);
  local_d0 = (undefined1  [8])absl::lts_20250127::log_internal::AsStatus(&local_d8);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_d0);
  if (bVar1) {
    local_150 = (Status *)0x0;
  }
  else {
    local_150 = (Status *)
                absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_d0,
                           "File::CreateDir(temp_directory_, 0777) is OK");
  }
  absl_log_internal_check_ok_goo.first = local_150;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_d0);
  absl::lts_20250127::Status::~Status(&local_d8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x32,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_d9,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_f0);
  }
  return;
}

Assistant:

CommandLineInterfaceTester::CommandLineInterfaceTester() {
  temp_directory_ = absl::StrCat(TestTempDir(), "/proto2_cli_test_temp");

  // If the temp directory already exists, it must be left over from a
  // previous run.  Delete it.
  if (FileExists(temp_directory_)) {
    File::DeleteRecursively(temp_directory_, NULL, NULL);
  }

  // Create the temp directory.
  ABSL_CHECK_OK(File::CreateDir(temp_directory_, 0777));
}